

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

int __thiscall Dictionary<int,_int>::open(Dictionary<int,_int> *this,char *__file,int __oflag,...)

{
  ion_err_t iVar1;
  ion_key_type_t iStack0000000000000010;
  ion_key_size_t iStack0000000000000014;
  ion_value_size_t iStack0000000000000018;
  ion_dictionary_size_t iStack000000000000001c;
  ion_err_t err;
  Dictionary<int,_int> *this_local;
  
  iVar1 = dictionary_open(&this->handler,&this->dict,
                          (ion_dictionary_config_info_t *)&stack0x00000008);
  this->key_type = iStack0000000000000010;
  this->key_size = iStack0000000000000014;
  this->value_size = iStack0000000000000018;
  this->dict_size = iStack000000000000001c;
  (this->last_status).error = iVar1;
  return (int)CONCAT71((int7)((ulong)this >> 8),iVar1);
}

Assistant:

ion_err_t
open(
	ion_dictionary_config_info_t config_info
) {
	ion_err_t err = dictionary_open(&handler, &dict, &config_info);

	key_type			= config_info.type;
	key_size			= config_info.key_size;
	value_size			= config_info.value_size;
	dict_size			= config_info.dictionary_size;
	last_status.error	= err;

	return err;
}